

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_publish(fio_publish_args_s args)

{
  fio_msg_internal_s *pfVar1;
  uint32_t type;
  fio_pubsub_engine_s *in_stack_00000008;
  fio_msg_internal_s *m;
  
  if (((int)args.engine == 0) || (in_stack_00000008 != (fio_pubsub_engine_s *)0x0)) {
    if (in_stack_00000008 == (fio_pubsub_engine_s *)0x0) {
      in_stack_00000008 = FIO_PUBSUB_DEFAULT;
    }
  }
  else {
    in_stack_00000008 = (fio_pubsub_engine_s *)&DAT_00000001;
  }
  switch(in_stack_00000008) {
  case (fio_pubsub_engine_s *)0x0:
  case (fio_pubsub_engine_s *)0x1:
    pfVar1 = fio_msg_internal_create
                       ((int)args.engine,(uint)((uint8_t)args.message.data != '\0'),
                        (fio_str_info_s)args._8_24_,(fio_str_info_s)args._32_24_,
                        (uint8_t)args.message.data,'\x01');
    fio_send2cluster(pfVar1);
    fio_publish2process(pfVar1);
    break;
  case (fio_pubsub_engine_s *)0x2:
    pfVar1 = fio_msg_internal_create
                       ((int)args.engine,0,(fio_str_info_s)args._8_24_,(fio_str_info_s)args._32_24_,
                        (uint8_t)args.message.data,'\x01');
    fio_publish2process(pfVar1);
    break;
  case (fio_pubsub_engine_s *)0x3:
    pfVar1 = fio_msg_internal_create
                       ((int)args.engine,(uint)((uint8_t)args.message.data != '\0'),
                        (fio_str_info_s)args._8_24_,(fio_str_info_s)args._32_24_,
                        (uint8_t)args.message.data,'\x01');
    fio_send2cluster(pfVar1);
    fio_msg_internal_free(pfVar1);
    break;
  case (fio_pubsub_engine_s *)0x4:
    type = 2;
    if ((uint8_t)args.message.data != '\0') {
      type = 3;
    }
    pfVar1 = fio_msg_internal_create
                       ((int)args.engine,type,(fio_str_info_s)args._8_24_,
                        (fio_str_info_s)args._32_24_,(uint8_t)args.message.data,'\x01');
    if ((fio_data->is_worker == '\0') || (fio_data->workers == 1)) {
      fio_publish2process(pfVar1);
    }
    else {
      fio_cluster_client_sender(pfVar1,-1);
    }
    break;
  default:
    if ((int)args.engine == 0) {
      (*in_stack_00000008->publish)
                (in_stack_00000008,(fio_str_info_s)args._8_24_,(fio_str_info_s)args._32_24_,
                 (uint8_t)args.message.data);
    }
    else if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "ERROR: (pub/sub) pub/sub engines can only be used for pub/sub messages (no filter)."
                    );
    }
  }
  return;
}

Assistant:

void fio_publish FIO_IGNORE_MACRO(fio_publish_args_s args) {
  if (args.filter && !args.engine) {
    args.engine = FIO_PUBSUB_CLUSTER;
  } else if (!args.engine) {
    args.engine = FIO_PUBSUB_DEFAULT;
  }
  fio_msg_internal_s *m = NULL;
  switch ((uintptr_t)args.engine) {
  case 0UL: /* fallthrough (missing default) */
  case 1UL: // ((uintptr_t)FIO_PUBSUB_CLUSTER):
    m = fio_msg_internal_create(
        args.filter,
        (args.is_json ? FIO_CLUSTER_MSG_JSON : FIO_CLUSTER_MSG_FORWARD),
        args.channel, args.message, args.is_json, 1);
    fio_send2cluster(m);
    fio_publish2process(m);
    break;
  case 2UL: // ((uintptr_t)FIO_PUBSUB_PROCESS):
    m = fio_msg_internal_create(args.filter, 0, args.channel, args.message,
                                args.is_json, 1);
    fio_publish2process(m);
    break;
  case 3UL: // ((uintptr_t)FIO_PUBSUB_SIBLINGS):
    m = fio_msg_internal_create(
        args.filter,
        (args.is_json ? FIO_CLUSTER_MSG_JSON : FIO_CLUSTER_MSG_FORWARD),
        args.channel, args.message, args.is_json, 1);
    fio_send2cluster(m);
    fio_msg_internal_free(m);
    m = NULL;
    break;
  case 4UL: // ((uintptr_t)FIO_PUBSUB_ROOT):
    m = fio_msg_internal_create(
        args.filter,
        (args.is_json ? FIO_CLUSTER_MSG_ROOT_JSON : FIO_CLUSTER_MSG_ROOT),
        args.channel, args.message, args.is_json, 1);
    if (fio_data->is_worker == 0 || fio_data->workers == 1) {
      fio_publish2process(m);
    } else {
      fio_cluster_client_sender(m, -1);
    }
    break;
  default:
    if (args.filter != 0) {
      FIO_LOG_ERROR("(pub/sub) pub/sub engines can only be used for "
                    "pub/sub messages (no filter).");
      return;
    }
    args.engine->publish(args.engine, args.channel, args.message, args.is_json);
  }
  return;
}